

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O2

void __thiscall
lunasvg::Canvas::drawImage
          (Canvas *this,Bitmap *image,Rect *dstRect,Rect *srcRect,Transform *transform)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  plutovg_matrix_t local_40;
  
  local_40.b = 0.0;
  local_40.c = 0.0;
  uVar1 = dstRect->w;
  uVar4 = dstRect->h;
  auVar7._4_4_ = uVar4;
  auVar7._0_4_ = uVar1;
  auVar7._8_8_ = 0;
  uVar2 = srcRect->w;
  uVar5 = srcRect->h;
  auVar8._4_4_ = uVar5;
  auVar8._0_4_ = uVar2;
  auVar8._8_8_ = 0;
  auVar8 = divps(auVar7,auVar8);
  local_40.a = auVar8._0_4_;
  local_40.d = auVar8._4_4_;
  uVar3 = srcRect->x;
  uVar6 = srcRect->y;
  local_40.f = -(float)uVar6 * local_40.d;
  local_40.e = -(float)uVar3 * local_40.a;
  plutovg_canvas_reset_matrix(this->m_canvas);
  plutovg_canvas_translate(this->m_canvas,(float)-this->m_x,(float)-this->m_y);
  plutovg_canvas_transform(this->m_canvas,&transform->m_matrix);
  plutovg_canvas_translate(this->m_canvas,dstRect->x,dstRect->y);
  plutovg_canvas_set_fill_rule(this->m_canvas,PLUTOVG_FILL_RULE_NON_ZERO);
  plutovg_canvas_set_operator(this->m_canvas,PLUTOVG_OPERATOR_SRC_OVER);
  plutovg_canvas_set_texture
            (this->m_canvas,image->m_surface,PLUTOVG_TEXTURE_TYPE_PLAIN,1.0,&local_40);
  plutovg_canvas_fill_rect(this->m_canvas,0.0,0.0,dstRect->w,dstRect->h);
  return;
}

Assistant:

void Canvas::drawImage(const Bitmap& image, const Rect& dstRect, const Rect& srcRect, const Transform& transform)
{
    auto xScale = dstRect.w / srcRect.w;
    auto yScale = dstRect.h / srcRect.h;
    plutovg_matrix_t matrix = { xScale, 0, 0, yScale, -srcRect.x * xScale, -srcRect.y * yScale };
    plutovg_canvas_reset_matrix(m_canvas);
    plutovg_canvas_translate(m_canvas, -m_x, -m_y);
    plutovg_canvas_transform(m_canvas, &transform.matrix());
    plutovg_canvas_translate(m_canvas, dstRect.x, dstRect.y);
    plutovg_canvas_set_fill_rule(m_canvas, PLUTOVG_FILL_RULE_NON_ZERO);
    plutovg_canvas_set_operator(m_canvas, PLUTOVG_OPERATOR_SRC_OVER);
    plutovg_canvas_set_texture(m_canvas, image.surface(), PLUTOVG_TEXTURE_TYPE_PLAIN, 1.f, &matrix);
    plutovg_canvas_fill_rect(m_canvas, 0, 0, dstRect.w, dstRect.h);
}